

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O2

void __thiscall
bssl::gtest_suite_PkitsTest03VerifyingNameChaining_::
Section3ValidRFC3280OptionalAttributeTypesTest8<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::~Section3ValidRFC3280OptionalAttributeTypesTest8
          (Section3ValidRFC3280OptionalAttributeTypesTest8<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest03VerifyingNameChaining,
                     Section3ValidRFC3280OptionalAttributeTypesTest8) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "RFC3280OptionalAttributeTypesCACert",
                               "ValidRFC3280OptionalAttributeTypesTest8EE"};
  const char* const crls[] = {"TrustAnchorRootCRL",
                              "RFC3280OptionalAttributeTypesCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.3.8";
  info.should_validate = true;

  this->RunTest(certs, crls, info);
}